

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O3

uint32_t * pack24_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 - base;
  *out = (in[1] - base) * 0x1000000 | uVar1 - base;
  uVar2 = in[1] - base >> 8;
  out[1] = uVar2;
  out[1] = (in[2] - base) * 0x10000 | uVar2;
  uVar2 = in[2] - base >> 0x10;
  out[2] = uVar2;
  out[2] = (in[3] - base) * 0x100 | uVar2;
  uVar1 = in[4];
  out[3] = uVar1 - base;
  out[3] = (in[5] - base) * 0x1000000 | uVar1 - base;
  uVar2 = in[5] - base >> 8;
  out[4] = uVar2;
  out[4] = (in[6] - base) * 0x10000 | uVar2;
  uVar2 = in[6] - base >> 0x10;
  out[5] = uVar2;
  out[5] = (in[7] - base) * 0x100 | uVar2;
  uVar1 = in[8];
  out[6] = uVar1 - base;
  out[6] = (in[9] - base) * 0x1000000 | uVar1 - base;
  uVar2 = in[9] - base >> 8;
  out[7] = uVar2;
  out[7] = (in[10] - base) * 0x10000 | uVar2;
  uVar2 = in[10] - base >> 0x10;
  out[8] = uVar2;
  out[8] = (in[0xb] - base) * 0x100 | uVar2;
  uVar1 = in[0xc];
  out[9] = uVar1 - base;
  out[9] = (in[0xd] - base) * 0x1000000 | uVar1 - base;
  uVar2 = in[0xd] - base >> 8;
  out[10] = uVar2;
  out[10] = (in[0xe] - base) * 0x10000 | uVar2;
  uVar2 = in[0xe] - base >> 0x10;
  out[0xb] = uVar2;
  out[0xb] = (in[0xf] - base) * 0x100 | uVar2;
  return out + 0xc;
}

Assistant:

uint32_t * pack24_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 24  -  16 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  16 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 24  -  8 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++out;
    ++in;
    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 24  -  16 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  16 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 24  -  8 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++out;
    ++in;
    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 24  -  16 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  16 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 24  -  8 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++out;
    ++in;
    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 24  -  16 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  16 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 24  -  8 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++out;
    ++in;

    return out;
}